

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O2

void doh_probe_done(Curl_easy *data,Curl_easy *doh,CURLcode result)

{
  doh_probes *pdVar1;
  curl_trc_feat *pcVar2;
  void *pvVar3;
  char *pcVar4;
  size_t len;
  long lVar5;
  dynbuf *s;
  
  pdVar1 = (data->state).async.doh;
  if (pdVar1 != (doh_probes *)0x0) {
    pvVar3 = Curl_meta_get(doh,"ezm:doh-p");
    if (pdVar1->probe_resp[0].probe_mid == doh->mid) {
      lVar5 = 0;
    }
    else {
      if (pdVar1->probe_resp[1].probe_mid != doh->mid) {
        Curl_failf(data,"unknown sub request done");
        return;
      }
      lVar5 = 1;
    }
    pdVar1->pending = pdVar1->pending - 1;
    if ((((doh->set).field_0x89f & 0x40) != 0) &&
       ((pcVar2 = (doh->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      Curl_infof(doh,"a DoH request is completed, %u to go");
    }
    pdVar1->probe_resp[lVar5].result = result;
    if (pvVar3 != (void *)0x0) {
      if (result == CURLE_OK) {
        pdVar1->probe_resp[lVar5].dnstype = *(DNStype *)((long)pvVar3 + 0x140);
        s = (dynbuf *)((long)pvVar3 + 0x118);
        pcVar4 = Curl_dyn_ptr(s);
        len = Curl_dyn_len(s);
        result = Curl_dyn_addn(&pdVar1->probe_resp[lVar5].body,pcVar4,len);
        Curl_dyn_free(s);
      }
      Curl_meta_remove(doh,"ezm:doh-p");
    }
    if (((result != CURLE_OK) && (((doh->set).field_0x89f & 0x40) != 0)) &&
       ((pcVar2 = (doh->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) {
      pcVar4 = curl_easy_strerror(result);
      Curl_infof(doh,"DoH request %s",pcVar4);
    }
    if (pdVar1->pending == 0) {
      Curl_expire(data,0,EXPIRE_RUN_NOW);
      return;
    }
  }
  return;
}

Assistant:

static void doh_probe_done(struct Curl_easy *data,
                           struct Curl_easy *doh, CURLcode result)
{
  struct doh_probes *dohp = data->state.async.doh;
  DEBUGASSERT(dohp);
  if(dohp) {
    struct doh_request *doh_req = Curl_meta_get(doh, CURL_EZM_DOH_PROBE);
    int i;

    for(i = 0; i < DOH_SLOT_COUNT; ++i) {
      if(dohp->probe_resp[i].probe_mid == doh->mid)
        break;
    }
    if(i >= DOH_SLOT_COUNT) {
      failf(data, "unknown sub request done");
      return;
    }

    dohp->pending--;
    infof(doh, "a DoH request is completed, %u to go", dohp->pending);
    dohp->probe_resp[i].result = result;
    /* We expect either the meta data still to exist or the sub request
     * to have already failed. */
    DEBUGASSERT(doh_req || result);
    if(doh_req) {
      if(!result) {
        dohp->probe_resp[i].dnstype = doh_req->dnstype;
        result = Curl_dyn_addn(&dohp->probe_resp[i].body,
                               Curl_dyn_ptr(&doh_req->resp_body),
                               Curl_dyn_len(&doh_req->resp_body));
        Curl_dyn_free(&doh_req->resp_body);
      }
      Curl_meta_remove(doh, CURL_EZM_DOH_PROBE);
    }

    if(result)
      infof(doh, "DoH request %s", curl_easy_strerror(result));

    if(!dohp->pending) {
      /* DoH completed, run the transfer picking up the results */
      Curl_expire(data, 0, EXPIRE_RUN_NOW);
    }
  }
}